

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

ExecutionResult __thiscall nigel::Lexer::postLexer(Lexer *this,CodeBase *base)

{
  Token *this_00;
  Lexer *this_01;
  byte bVar1;
  element_type *peVar2;
  undefined1 *****pppppuVar3;
  undefined1 *****pppppuVar4;
  int iVar5;
  _List_node_base *p_Var6;
  size_t index;
  _List_node_base *p_Var7;
  _Sp_alloc_shared_tag<std::allocator<nigel::Token>_> __tag;
  Lexer *pLVar8;
  list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_> *lexerStruct;
  _Node *__tmp;
  bool bVar9;
  element_type *peVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  String identifier_2;
  String identifier;
  list<std::_List_iterator<std::shared_ptr<nigel::Token>_>,_std::allocator<std::_List_iterator<std::shared_ptr<nigel::Token>_>_>_>
  toRemove;
  undefined1 local_2d8 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_2b0;
  undefined1 local_2a8 [88];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_250;
  _List_node_base local_248;
  _List_node_base local_230;
  _List_node_base local_218;
  undefined1 *****local_208;
  undefined1 *****local_200;
  long local_1f8;
  long *local_1f0 [2];
  long local_1e0 [2];
  long *local_1d0 [2];
  long local_1c0 [2];
  long *local_1b0 [2];
  long local_1a0 [2];
  long *local_190 [2];
  long local_180 [2];
  long *local_170 [2];
  long local_160 [2];
  long *local_150 [2];
  long local_140 [2];
  long *local_130 [2];
  long local_120 [2];
  long *local_110 [2];
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0 [2];
  long local_c0 [2];
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_208 = (undefined1 *****)&local_208;
  local_1f8 = 0;
  p_Var7 = (base->lexerStruct).
           super__List_base<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  lexerStruct = &base->lexerStruct;
  if (p_Var7 != (_List_node_base *)lexerStruct) {
    this_01 = (Lexer *)(local_2a8 + 0x50);
    this_00 = (Token *)(local_2d8 + 0x20);
    local_200 = local_208;
    do {
      iVar5 = *(int *)&p_Var7[1]._M_next[1]._M_prev;
      local_230._M_next = p_Var7;
      if (iVar5 == 0x3b) {
        Token::as<nigel::Token_DividingToken>((Token *)this_01);
        bVar1 = *(byte *)&((_List_node_base *)(local_2a8._80_8_ + 0x50))->_M_next;
        if (_Stack_250._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_250._M_pi);
        }
        if (bVar1 < 0x3a) {
          switch(bVar1) {
          case 0x23:
            local_2d8._32_4_ = 0x3d;
            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_01,
                       (allocator<nigel::Token> *)local_2d8,(Type *)this_00);
            break;
          case 0x24:
            local_2d8._32_4_ = 0x3c;
            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_01,
                       (allocator<nigel::Token> *)local_2d8,(Type *)this_00);
            break;
          default:
            goto switchD_00162930_caseD_5e;
          case 0x28:
            local_2d8._32_4_ = 0x3e;
            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_01,
                       (allocator<nigel::Token> *)local_2d8,(Type *)this_00);
            break;
          case 0x29:
            local_2d8._32_4_ = 0x3f;
            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_01,
                       (allocator<nigel::Token> *)local_2d8,(Type *)this_00);
            break;
          case 0x2c:
            local_2d8._32_4_ = 0x44;
            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_01,
                       (allocator<nigel::Token> *)local_2d8,(Type *)this_00);
            break;
          case 0x2e:
            local_2d8._32_4_ = 0x45;
            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_01,
                       (allocator<nigel::Token> *)local_2d8,(Type *)this_00);
          }
          goto LAB_00162f93;
        }
        if (0x5a < bVar1) {
          switch(bVar1) {
          case 0x5b:
            local_2d8._32_4_ = 0x40;
            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_01,
                       (allocator<nigel::Token> *)local_2d8,(Type *)this_00);
            break;
          case 0x5c:
            local_2d8._32_4_ = 0x4a;
            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_01,
                       (allocator<nigel::Token> *)local_2d8,(Type *)this_00);
            break;
          case 0x5d:
            local_2d8._32_4_ = 0x41;
            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_01,
                       (allocator<nigel::Token> *)local_2d8,(Type *)this_00);
            break;
          case 0x5e:
          case 0x5f:
            goto switchD_00162930_caseD_5e;
          case 0x60:
            local_2d8._32_4_ = 0x4b;
            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_01,
                       (allocator<nigel::Token> *)local_2d8,(Type *)this_00);
            break;
          default:
            if (bVar1 == 0x7b) {
              local_2d8._32_4_ = 0x42;
              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_01,
                         (allocator<nigel::Token> *)local_2d8,(Type *)this_00);
            }
            else {
              if (bVar1 != 0x7d) goto switchD_00162930_caseD_5e;
              local_2d8._32_4_ = 0x43;
              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_01,
                         (allocator<nigel::Token> *)local_2d8,(Type *)this_00);
            }
          }
          goto LAB_00162f93;
        }
        switch(bVar1) {
        case 0x3a:
          local_2d8._32_4_ = 0x46;
          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                    ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_01,
                     (allocator<nigel::Token> *)local_2d8,(Type *)this_00);
          break;
        case 0x3b:
          local_2d8._32_4_ = 0x47;
          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                    ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_01,
                     (allocator<nigel::Token> *)local_2d8,(Type *)this_00);
          break;
        default:
          goto switchD_00162930_caseD_5e;
        case 0x3f:
          local_2d8._32_4_ = 0x48;
          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                    ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_01,
                     (allocator<nigel::Token> *)local_2d8,(Type *)this_00);
          break;
        case 0x40:
          local_2d8._32_4_ = 0x49;
          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                    ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_01,
                     (allocator<nigel::Token> *)local_2d8,(Type *)this_00);
        }
LAB_00162f93:
        peVar10 = (element_type *)p_Var7[1]._M_next;
        this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7[1]._M_prev;
        p_Var7[1]._M_next = (_List_node_base *)local_2a8._80_8_;
        p_Var7[1]._M_prev = (_List_node_base *)_Stack_250._M_pi;
      }
      else {
        if (iVar5 == 0x18) {
          Token::as<nigel::Token_Operator>(this_00);
          local_2a8._80_8_ = &local_248;
          peVar2 = (((shared_ptr<boost::filesystem::path> *)(local_2d8._32_8_ + 0x50))->
                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)this_01,peVar2,
                     (long)&((((shared_ptr<boost::filesystem::path> *)(local_2d8._32_8_ + 0x50))->
                             super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                             )._M_refcount._M_pi)->_vptr__Sp_counted_base + (long)peVar2);
          if (p_Stack_2b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2b0);
          }
          peVar10 = (element_type *)0x0;
          this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1 < _Stack_250._M_pi) {
            std::__cxx11::string::substr((ulong)this_00,(ulong)this_01);
            iVar5 = std::__cxx11::string::compare((char *)this_00);
            if (iVar5 == 0) {
              bVar9 = true;
            }
            else {
              std::__cxx11::string::substr((ulong)local_2d8,(ulong)this_01);
              iVar5 = std::__cxx11::string::compare(local_2d8);
              bVar9 = iVar5 == 0;
              if ((_List_node_base *)local_2d8._0_8_ != (_List_node_base *)(local_2d8 + 0x10)) {
                operator_delete((void *)local_2d8._0_8_,
                                (ulong)((long)(_func_int ***)local_2d8._16_8_ + 1));
              }
            }
            pLVar8 = (Lexer *)local_2d8._32_8_;
            if ((Lexer *)local_2d8._32_8_ != (Lexer *)local_2a8) {
              operator_delete((void *)local_2d8._32_8_,
                              (ulong)((long)&((_Alloc_hider *)local_2a8._0_8_)->_M_p + 1));
            }
            if (bVar9) {
              index = 3;
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3 < _Stack_250._M_pi) {
LAB_001633ff:
                splitToken(pLVar8,(String *)this_01,index,(iterator *)&local_230,lexerStruct);
              }
            }
            else {
              std::__cxx11::string::substr((ulong)this_00,(ulong)this_01);
              iVar5 = std::__cxx11::string::compare((char *)this_00);
              if (iVar5 == 0) {
                bVar9 = true;
              }
              else {
                std::__cxx11::string::substr((ulong)local_2d8,(ulong)this_01);
                iVar5 = std::__cxx11::string::compare(local_2d8);
                if (iVar5 == 0) {
                  bVar9 = true;
                }
                else {
                  std::__cxx11::string::substr((ulong)(local_2a8 + 0x10),(ulong)this_01);
                  iVar5 = std::__cxx11::string::compare(local_2a8 + 0x10);
                  if (iVar5 == 0) {
                    bVar9 = true;
                  }
                  else {
                    std::__cxx11::string::substr((ulong)&local_230._M_prev,(ulong)this_01);
                    iVar5 = std::__cxx11::string::compare((char *)&local_230._M_prev);
                    if (iVar5 == 0) {
                      bVar9 = true;
                    }
                    else {
                      std::__cxx11::string::substr((ulong)local_70,(ulong)this_01);
                      iVar5 = std::__cxx11::string::compare((char *)local_70);
                      if (iVar5 == 0) {
                        bVar9 = true;
                      }
                      else {
                        std::__cxx11::string::substr((ulong)local_90,(ulong)this_01);
                        iVar5 = std::__cxx11::string::compare((char *)local_90);
                        if (iVar5 == 0) {
                          bVar9 = true;
                        }
                        else {
                          std::__cxx11::string::substr((ulong)local_b0,(ulong)this_01);
                          iVar5 = std::__cxx11::string::compare((char *)local_b0);
                          if (iVar5 == 0) {
                            bVar9 = true;
                          }
                          else {
                            std::__cxx11::string::substr((ulong)local_d0,(ulong)this_01);
                            iVar5 = std::__cxx11::string::compare((char *)local_d0);
                            if (iVar5 == 0) {
                              bVar9 = true;
                            }
                            else {
                              std::__cxx11::string::substr((ulong)local_f0,(ulong)this_01);
                              iVar5 = std::__cxx11::string::compare((char *)local_f0);
                              if (iVar5 == 0) {
                                bVar9 = true;
                              }
                              else {
                                std::__cxx11::string::substr((ulong)local_110,(ulong)this_01);
                                iVar5 = std::__cxx11::string::compare((char *)local_110);
                                if (iVar5 == 0) {
                                  bVar9 = true;
                                }
                                else {
                                  std::__cxx11::string::substr((ulong)local_130,(ulong)this_01);
                                  iVar5 = std::__cxx11::string::compare((char *)local_130);
                                  if (iVar5 == 0) {
                                    bVar9 = true;
                                  }
                                  else {
                                    std::__cxx11::string::substr((ulong)local_150,(ulong)this_01);
                                    iVar5 = std::__cxx11::string::compare((char *)local_150);
                                    if (iVar5 == 0) {
                                      bVar9 = true;
                                    }
                                    else {
                                      std::__cxx11::string::substr((ulong)local_170,(ulong)this_01);
                                      iVar5 = std::__cxx11::string::compare((char *)local_170);
                                      if (iVar5 == 0) {
                                        bVar9 = true;
                                      }
                                      else {
                                        std::__cxx11::string::substr
                                                  ((ulong)local_190,(ulong)this_01);
                                        iVar5 = std::__cxx11::string::compare((char *)local_190);
                                        if (iVar5 == 0) {
                                          bVar9 = true;
                                        }
                                        else {
                                          std::__cxx11::string::substr
                                                    ((ulong)local_1b0,(ulong)this_01);
                                          iVar5 = std::__cxx11::string::compare((char *)local_1b0);
                                          if (iVar5 == 0) {
                                            bVar9 = true;
                                          }
                                          else {
                                            std::__cxx11::string::substr
                                                      ((ulong)local_1d0,(ulong)this_01);
                                            iVar5 = std::__cxx11::string::compare((char *)local_1d0)
                                            ;
                                            if (iVar5 == 0) {
                                              bVar9 = true;
                                            }
                                            else {
                                              std::__cxx11::string::substr
                                                        ((ulong)local_1f0,(ulong)this_01);
                                              iVar5 = std::__cxx11::string::compare
                                                                ((char *)local_1f0);
                                              if (iVar5 == 0) {
                                                bVar9 = true;
                                              }
                                              else {
                                                std::__cxx11::string::substr
                                                          ((ulong)local_50,(ulong)this_01);
                                                iVar5 = std::__cxx11::string::compare
                                                                  ((char *)local_50);
                                                bVar9 = iVar5 == 0;
                                                if (local_50[0] != local_40) {
                                                  operator_delete(local_50[0],local_40[0] + 1);
                                                }
                                              }
                                              if (local_1f0[0] != local_1e0) {
                                                operator_delete(local_1f0[0],local_1e0[0] + 1);
                                              }
                                            }
                                            if (local_1d0[0] != local_1c0) {
                                              operator_delete(local_1d0[0],local_1c0[0] + 1);
                                            }
                                          }
                                          if (local_1b0[0] != local_1a0) {
                                            operator_delete(local_1b0[0],local_1a0[0] + 1);
                                          }
                                        }
                                        if (local_190[0] != local_180) {
                                          operator_delete(local_190[0],local_180[0] + 1);
                                        }
                                      }
                                      if (local_170[0] != local_160) {
                                        operator_delete(local_170[0],local_160[0] + 1);
                                      }
                                    }
                                    if (local_150[0] != local_140) {
                                      operator_delete(local_150[0],local_140[0] + 1);
                                    }
                                  }
                                  if (local_130[0] != local_120) {
                                    operator_delete(local_130[0],local_120[0] + 1);
                                  }
                                }
                                if (local_110[0] != local_100) {
                                  operator_delete(local_110[0],local_100[0] + 1);
                                }
                              }
                              if (local_f0[0] != local_e0) {
                                operator_delete(local_f0[0],local_e0[0] + 1);
                              }
                            }
                            if (local_d0[0] != local_c0) {
                              operator_delete(local_d0[0],local_c0[0] + 1);
                            }
                          }
                          if (local_b0[0] != local_a0) {
                            operator_delete(local_b0[0],local_a0[0] + 1);
                          }
                        }
                        if (local_90[0] != local_80) {
                          operator_delete(local_90[0],local_80[0] + 1);
                        }
                      }
                      if (local_70[0] != local_60) {
                        operator_delete(local_70[0],local_60[0] + 1);
                      }
                    }
                    if (local_230._M_prev != &local_218) {
                      operator_delete(local_230._M_prev,
                                      (ulong)((long)&(local_218._M_next)->_M_next + 1));
                    }
                  }
                  if ((undefined1 *)CONCAT44(local_2a8._20_4_,local_2a8._16_4_) != local_2a8 + 0x20)
                  {
                    operator_delete((undefined1 *)CONCAT44(local_2a8._20_4_,local_2a8._16_4_),
                                    local_2a8._32_8_ + 1);
                  }
                }
                if ((_List_node_base *)local_2d8._0_8_ != (_List_node_base *)(local_2d8 + 0x10)) {
                  operator_delete((void *)local_2d8._0_8_,
                                  (ulong)((long)(_func_int ***)local_2d8._16_8_ + 1));
                }
              }
              pLVar8 = (Lexer *)local_2d8._32_8_;
              if ((Lexer *)local_2d8._32_8_ != (Lexer *)local_2a8) {
                operator_delete((void *)local_2d8._32_8_,
                                (ulong)((long)&((_Alloc_hider *)local_2a8._0_8_)->_M_p + 1));
              }
              index = 2;
              if ((bool)(bVar9 & (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2 <
                                 _Stack_250._M_pi)) goto LAB_001633ff;
            }
            __tag._M_a = (allocator<nigel::Token> *)(local_2a8 + 0x10);
            iVar5 = std::__cxx11::string::compare((char *)this_01);
            if (iVar5 == 0) {
              local_2d8._0_4_ = 0x2f;
              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_00,__tag,
                         (Type *)local_2d8);
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)this_01);
              if (iVar5 == 0) {
                local_2d8._0_4_ = 0x30;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_00,__tag,
                           (Type *)local_2d8);
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)this_01);
                if (iVar5 == 0) {
                  local_2d8._0_4_ = 0x31;
                  std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                            ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_00,__tag,
                             (Type *)local_2d8);
                }
                else {
                  iVar5 = std::__cxx11::string::compare((char *)this_01);
                  if (iVar5 == 0) {
                    local_2d8._0_4_ = 0x32;
                    std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                              ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_00,
                               __tag,(Type *)local_2d8);
                  }
                  else {
                    iVar5 = std::__cxx11::string::compare((char *)this_01);
                    if (iVar5 == 0) {
                      local_2d8._0_4_ = 0x33;
                      std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_00,
                                 __tag,(Type *)local_2d8);
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare((char *)this_01);
                      if (iVar5 == 0) {
                        local_2d8._0_4_ = 0x1e;
                        std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                  ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_00,
                                   __tag,(Type *)local_2d8);
                      }
                      else {
                        iVar5 = std::__cxx11::string::compare((char *)this_01);
                        if (iVar5 == 0) {
                          local_2d8._0_4_ = 0x1f;
                          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                    ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)
                                     this_00,__tag,(Type *)local_2d8);
                        }
                        else {
                          iVar5 = std::__cxx11::string::compare((char *)this_01);
                          if (iVar5 == 0) {
                            local_2d8._0_4_ = 0x22;
                            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)
                                       this_00,__tag,(Type *)local_2d8);
                          }
                          else {
                            iVar5 = std::__cxx11::string::compare((char *)this_01);
                            if (iVar5 == 0) {
                              local_2d8._0_4_ = 0x23;
                              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)
                                         this_00,__tag,(Type *)local_2d8);
                            }
                            else {
                              iVar5 = std::__cxx11::string::compare((char *)this_01);
                              if (iVar5 == 0) {
                                local_2d8._0_4_ = 0x36;
                                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)
                                           this_00,__tag,(Type *)local_2d8);
                              }
                              else {
                                iVar5 = std::__cxx11::string::compare((char *)this_01);
                                if (iVar5 == 0) {
                                  local_2d8._0_4_ = 0x37;
                                  std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                                  __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                            ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                              *)this_00,__tag,(Type *)local_2d8);
                                }
                                else {
                                  iVar5 = std::__cxx11::string::compare((char *)this_01);
                                  if (iVar5 == 0) {
                                    local_2d8._0_4_ = 0x38;
                                    std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                                    __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                              ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                *)this_00,__tag,(Type *)local_2d8);
                                  }
                                  else {
                                    iVar5 = std::__cxx11::string::compare((char *)this_01);
                                    if (iVar5 == 0) {
                                      local_2d8._0_4_ = 0x28;
                                      std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                                      __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)this_00,__tag,(Type *)local_2d8);
                                    }
                                    else {
                                      iVar5 = std::__cxx11::string::compare((char *)this_01);
                                      if (iVar5 == 0) {
                                        local_2d8._0_4_ = 0x2a;
                                        std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                                        __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                  ((
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)this_00,__tag,(Type *)local_2d8);
                                      }
                                      else {
                                        iVar5 = std::__cxx11::string::compare((char *)this_01);
                                        if (iVar5 == 0) {
                                          local_2d8._0_4_ = 0x24;
                                          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                          ::
                                          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                    ((
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)this_00,__tag,(Type *)local_2d8);
                                        }
                                        else {
                                          iVar5 = std::__cxx11::string::compare((char *)this_01);
                                          if (iVar5 == 0) {
                                            local_2d8._0_4_ = 0x25;
                                            std::
                                            __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                                            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                      ((
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)this_00,__tag,(Type *)local_2d8);
                                          }
                                          else {
                                            iVar5 = std::__cxx11::string::compare((char *)this_01);
                                            if (iVar5 == 0) {
                                              local_2d8._0_4_ = 0x34;
                                              std::
                                              __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                              ::
                                              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                        ((
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)this_00,__tag,(Type *)local_2d8);
                                            }
                                            else {
                                              iVar5 = std::__cxx11::string::compare((char *)this_01)
                                              ;
                                              if (iVar5 == 0) {
                                                local_2d8._0_4_ = 0x35;
                                                std::
                                                __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                ::
                                                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                          ((
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)this_00,__tag,(Type *)local_2d8);
                                              }
                                              else {
                                                iVar5 = std::__cxx11::string::compare
                                                                  ((char *)this_01);
                                                if (iVar5 == 0) {
                                                  local_2d8._0_4_ = 0x39;
                                                  std::
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  ::
                                                  __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                            ((
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)this_00,__tag,(Type *)local_2d8);
                                                }
                                                else {
                                                  pLVar8 = this_01;
                                                  iVar5 = std::__cxx11::string::compare
                                                                    ((char *)this_01);
                                                  if (iVar5 != 0) {
                                                    splitToken(pLVar8,(String *)this_01,1,
                                                               (iterator *)&local_230,lexerStruct);
                                                    peVar10 = (element_type *)0x0;
                                                    this_02 = (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                                  ;
                                                  goto LAB_00163811;
                                                  }
                                                  local_2d8._0_4_ = 0x3a;
                                                  std::
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  ::
                                                  __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                            ((
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)this_00,__tag,(Type *)local_2d8);
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            peVar10 = (element_type *)local_230._M_next[1]._M_next;
            this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_230._M_next[1]._M_prev;
            local_230._M_next[1]._M_next = (_List_node_base *)local_2d8._32_8_;
            local_230._M_next[1]._M_prev = (_List_node_base *)p_Stack_2b0;
          }
LAB_00163811:
          p_Var7 = local_230._M_next;
          if (_Stack_250._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1) {
            local_2a8._64_8_ = peVar10;
            local_2a8._72_8_ = this_02;
            Token::as<nigel::Token_Operator>((Token *)local_2d8);
            local_2d8._32_8_ = local_2a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)this_00,((_List_node_base *)(local_2d8._0_8_ + 0x50))->_M_next,
                       (long)&((_List_node_base *)(local_2d8._0_8_ + 0x50))->_M_prev->_M_next +
                       (long)((_List_node_base *)(local_2d8._0_8_ + 0x50))->_M_next);
            if ((element_type *)local_2d8._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
            }
            iVar5 = std::__cxx11::string::compare((char *)this_00);
            if (iVar5 == 0) {
              local_2a8._16_4_ = 0x19;
              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2d8,
                         (_Sp_alloc_shared_tag<std::allocator<nigel::Token>_>)&local_230._M_prev,
                         (Type *)(local_2a8 + 0x10));
LAB_00163b44:
              local_2a8._48_8_ = local_2d8._0_8_;
              local_2a8._56_8_ = local_2d8._8_8_;
              local_2d8._0_8_ = (_List_node_base *)0x0;
              local_2d8._8_8_ = (element_type *)0x0;
              if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT44(local_2a8._68_4_,local_2a8._72_4_) !=
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             CONCAT44(local_2a8._68_4_,local_2a8._72_4_)),
                 (element_type *)local_2d8._8_8_ != (element_type *)0x0)) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
              }
              peVar10 = (element_type *)p_Var7[1]._M_next;
              this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7[1]._M_prev;
              p_Var7[1]._M_next = (_List_node_base *)local_2a8._48_8_;
              p_Var7[1]._M_prev = (_List_node_base *)local_2a8._56_8_;
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)this_00);
              if (iVar5 == 0) {
                local_2a8._16_4_ = 0x1a;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2d8,
                           (_Sp_alloc_shared_tag<std::allocator<nigel::Token>_>)&local_230._M_prev,
                           (Type *)(local_2a8 + 0x10));
                goto LAB_00163b44;
              }
              iVar5 = std::__cxx11::string::compare((char *)this_00);
              if (iVar5 == 0) {
                local_2a8._16_4_ = 0x1b;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2d8,
                           (_Sp_alloc_shared_tag<std::allocator<nigel::Token>_>)&local_230._M_prev,
                           (Type *)(local_2a8 + 0x10));
                goto LAB_00163b44;
              }
              iVar5 = std::__cxx11::string::compare((char *)this_00);
              if (iVar5 == 0) {
                local_2a8._16_4_ = 0x1c;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2d8,
                           (_Sp_alloc_shared_tag<std::allocator<nigel::Token>_>)&local_230._M_prev,
                           (Type *)(local_2a8 + 0x10));
                goto LAB_00163b44;
              }
              iVar5 = std::__cxx11::string::compare((char *)this_00);
              if (iVar5 == 0) {
                local_2a8._16_4_ = 0x1d;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2d8,
                           (_Sp_alloc_shared_tag<std::allocator<nigel::Token>_>)&local_230._M_prev,
                           (Type *)(local_2a8 + 0x10));
                goto LAB_00163b44;
              }
              iVar5 = std::__cxx11::string::compare((char *)this_00);
              if (iVar5 == 0) {
                local_2a8._16_4_ = 0x2d;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2d8,
                           (_Sp_alloc_shared_tag<std::allocator<nigel::Token>_>)&local_230._M_prev,
                           (Type *)(local_2a8 + 0x10));
                goto LAB_00163b44;
              }
              iVar5 = std::__cxx11::string::compare((char *)this_00);
              if (iVar5 == 0) {
                local_2a8._16_4_ = 0x20;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2d8,
                           (_Sp_alloc_shared_tag<std::allocator<nigel::Token>_>)&local_230._M_prev,
                           (Type *)(local_2a8 + 0x10));
                goto LAB_00163b44;
              }
              iVar5 = std::__cxx11::string::compare((char *)this_00);
              if (iVar5 == 0) {
                local_2a8._16_4_ = 0x21;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2d8,
                           (_Sp_alloc_shared_tag<std::allocator<nigel::Token>_>)&local_230._M_prev,
                           (Type *)(local_2a8 + 0x10));
                goto LAB_00163b44;
              }
              iVar5 = std::__cxx11::string::compare((char *)this_00);
              if (iVar5 == 0) {
                local_2a8._16_4_ = 0x26;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2d8,
                           (_Sp_alloc_shared_tag<std::allocator<nigel::Token>_>)&local_230._M_prev,
                           (Type *)(local_2a8 + 0x10));
                goto LAB_00163b44;
              }
              iVar5 = std::__cxx11::string::compare((char *)this_00);
              if (iVar5 == 0) {
                local_2a8._16_4_ = 0x27;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2d8,
                           (_Sp_alloc_shared_tag<std::allocator<nigel::Token>_>)&local_230._M_prev,
                           (Type *)(local_2a8 + 0x10));
                goto LAB_00163b44;
              }
              iVar5 = std::__cxx11::string::compare((char *)this_00);
              if (iVar5 == 0) {
                local_2a8._16_4_ = 0x29;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2d8,
                           (_Sp_alloc_shared_tag<std::allocator<nigel::Token>_>)&local_230._M_prev,
                           (Type *)(local_2a8 + 0x10));
                goto LAB_00163b44;
              }
              iVar5 = std::__cxx11::string::compare((char *)this_00);
              if (iVar5 == 0) {
                local_2a8._16_4_ = 0x2b;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2d8,
                           (_Sp_alloc_shared_tag<std::allocator<nigel::Token>_>)&local_230._M_prev,
                           (Type *)(local_2a8 + 0x10));
                goto LAB_00163b44;
              }
              iVar5 = std::__cxx11::string::compare((char *)this_00);
              peVar10 = (element_type *)local_2a8._64_8_;
              this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._72_8_;
              if (iVar5 == 0) {
                local_2a8._16_4_ = 0x2c;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)local_2d8,
                           (_Sp_alloc_shared_tag<std::allocator<nigel::Token>_>)&local_230._M_prev,
                           (Type *)(local_2a8 + 0x10));
                goto LAB_00163b44;
              }
            }
            if ((Lexer *)local_2d8._32_8_ != (Lexer *)local_2a8) {
              local_2a8._64_8_ = peVar10;
              local_2a8._72_8_ = this_02;
              operator_delete((void *)local_2d8._32_8_,
                              (ulong)((long)&((_Alloc_hider *)local_2a8._0_8_)->_M_p + 1));
              peVar10 = (element_type *)local_2a8._64_8_;
              this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._72_8_;
            }
          }
        }
        else {
          if (iVar5 != 3) goto switchD_00162930_caseD_5e;
          Token::as<nigel::Token_Identifier>(this_00);
          local_2a8._80_8_ = &local_248;
          peVar2 = (((shared_ptr<boost::filesystem::path> *)(local_2d8._32_8_ + 0x50))->
                   super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)this_01,peVar2,
                     (long)&((((shared_ptr<boost::filesystem::path> *)(local_2d8._32_8_ + 0x50))->
                             super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>
                             )._M_refcount._M_pi)->_vptr__Sp_counted_base + (long)peVar2);
          if (p_Stack_2b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_2b0);
          }
          iVar5 = std::__cxx11::string::compare((char *)this_01);
          if (iVar5 == 0) {
            local_2d8._0_4_ = 1;
            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_00,
                       (allocator<nigel::Token> *)(local_2a8 + 0x10),(Type *)local_2d8);
          }
          else {
            iVar5 = std::__cxx11::string::compare((char *)this_01);
            if (iVar5 == 0) {
              local_2d8._0_4_ = 4;
              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_00,
                         (allocator<nigel::Token> *)(local_2a8 + 0x10),(Type *)local_2d8);
            }
            else {
              iVar5 = std::__cxx11::string::compare((char *)this_01);
              if (iVar5 == 0) {
                local_2d8._0_4_ = 5;
                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_00,
                           (allocator<nigel::Token> *)(local_2a8 + 0x10),(Type *)local_2d8);
              }
              else {
                iVar5 = std::__cxx11::string::compare((char *)this_01);
                if (iVar5 == 0) {
                  local_2d8._0_4_ = 6;
                  std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                  __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                            ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_00,
                             (allocator<nigel::Token> *)(local_2a8 + 0x10),(Type *)local_2d8);
                }
                else {
                  iVar5 = std::__cxx11::string::compare((char *)this_01);
                  if (iVar5 == 0) {
                    local_2d8._0_4_ = 7;
                    std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                    __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                              ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_00,
                               (allocator<nigel::Token> *)(local_2a8 + 0x10),(Type *)local_2d8);
                  }
                  else {
                    iVar5 = std::__cxx11::string::compare((char *)this_01);
                    if (iVar5 == 0) {
                      local_2d8._0_4_ = 8;
                      std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                      __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_00,
                                 (allocator<nigel::Token> *)(local_2a8 + 0x10),(Type *)local_2d8);
                    }
                    else {
                      iVar5 = std::__cxx11::string::compare((char *)this_01);
                      if (iVar5 == 0) {
                        local_2d8._0_4_ = 9;
                        std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                        __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                  ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)this_00,
                                   (allocator<nigel::Token> *)(local_2a8 + 0x10),(Type *)local_2d8);
                      }
                      else {
                        iVar5 = std::__cxx11::string::compare((char *)this_01);
                        if (iVar5 == 0) {
                          local_2d8._0_4_ = 10;
                          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                    ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)
                                     this_00,(allocator<nigel::Token> *)(local_2a8 + 0x10),
                                     (Type *)local_2d8);
                        }
                        else {
                          iVar5 = std::__cxx11::string::compare((char *)this_01);
                          if (iVar5 == 0) {
                            local_2d8._0_4_ = 0xb;
                            std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                      ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)
                                       this_00,(allocator<nigel::Token> *)(local_2a8 + 0x10),
                                       (Type *)local_2d8);
                          }
                          else {
                            iVar5 = std::__cxx11::string::compare((char *)this_01);
                            if (iVar5 == 0) {
                              local_2d8._0_4_ = 0xc;
                              std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                        ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)
                                         this_00,(allocator<nigel::Token> *)(local_2a8 + 0x10),
                                         (Type *)local_2d8);
                            }
                            else {
                              iVar5 = std::__cxx11::string::compare((char *)this_01);
                              if (iVar5 == 0) {
                                local_2d8._0_4_ = 0xd;
                                std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                                __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                          ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2> *)
                                           this_00,(allocator<nigel::Token> *)(local_2a8 + 0x10),
                                           (Type *)local_2d8);
                              }
                              else {
                                iVar5 = std::__cxx11::string::compare((char *)this_01);
                                if (iVar5 == 0) {
                                  local_2d8._0_4_ = 0xe;
                                  std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                                  __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                            ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                              *)this_00,
                                             (allocator<nigel::Token> *)(local_2a8 + 0x10),
                                             (Type *)local_2d8);
                                }
                                else {
                                  iVar5 = std::__cxx11::string::compare((char *)this_01);
                                  if (iVar5 == 0) {
                                    local_2d8._0_4_ = 0xf;
                                    std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                                    __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                              ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                *)this_00,
                                               (allocator<nigel::Token> *)(local_2a8 + 0x10),
                                               (Type *)local_2d8);
                                  }
                                  else {
                                    iVar5 = std::__cxx11::string::compare((char *)this_01);
                                    if (iVar5 == 0) {
                                      local_2d8._0_4_ = 0x10;
                                      std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                                      __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                ((__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)this_00,
                                                 (allocator<nigel::Token> *)(local_2a8 + 0x10),
                                                 (Type *)local_2d8);
                                    }
                                    else {
                                      iVar5 = std::__cxx11::string::compare((char *)this_01);
                                      if (iVar5 == 0) {
                                        local_2d8._0_4_ = 0x11;
                                        std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                                        __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                  ((
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)this_00,
                                                  (allocator<nigel::Token> *)(local_2a8 + 0x10),
                                                  (Type *)local_2d8);
                                      }
                                      else {
                                        iVar5 = std::__cxx11::string::compare((char *)this_01);
                                        if (iVar5 == 0) {
                                          local_2d8._0_4_ = 0x12;
                                          std::__shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                          ::
                                          __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                    ((
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)this_00,
                                                  (allocator<nigel::Token> *)(local_2a8 + 0x10),
                                                  (Type *)local_2d8);
                                        }
                                        else {
                                          iVar5 = std::__cxx11::string::compare((char *)this_01);
                                          if (iVar5 == 0) {
                                            local_2d8._0_4_ = 0x13;
                                            std::
                                            __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>::
                                            __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                      ((
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)this_00,
                                                  (allocator<nigel::Token> *)(local_2a8 + 0x10),
                                                  (Type *)local_2d8);
                                          }
                                          else {
                                            iVar5 = std::__cxx11::string::compare((char *)this_01);
                                            if (iVar5 == 0) {
                                              local_2d8._0_4_ = 0x16;
                                              std::
                                              __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                              ::
                                              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                        ((
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)this_00,
                                                  (allocator<nigel::Token> *)(local_2a8 + 0x10),
                                                  (Type *)local_2d8);
                                            }
                                            else {
                                              iVar5 = std::__cxx11::string::compare((char *)this_01)
                                              ;
                                              peVar10 = (element_type *)0x0;
                                              this_02 = (
                                                  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0
                                              ;
                                              if (iVar5 != 0) goto LAB_00163baf;
                                              local_2d8._0_4_ = 0x17;
                                              std::
                                              __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                              ::
                                              __shared_ptr<std::allocator<nigel::Token>,nigel::Token::Type>
                                                        ((
                                                  __shared_ptr<nigel::Token,(__gnu_cxx::_Lock_policy)2>
                                                  *)this_00,
                                                  (allocator<nigel::Token> *)(local_2a8 + 0x10),
                                                  (Type *)local_2d8);
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          peVar10 = (element_type *)p_Var7[1]._M_next;
          this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var7[1]._M_prev;
          p_Var7[1]._M_next = (_List_node_base *)local_2d8._32_8_;
          p_Var7[1]._M_prev = (_List_node_base *)p_Stack_2b0;
        }
LAB_00163baf:
        if ((_List_node_base *)local_2a8._80_8_ != &local_248) {
          local_2a8._64_8_ = peVar10;
          local_2a8._72_8_ = this_02;
          operator_delete((void *)local_2a8._80_8_,(ulong)((long)&(local_248._M_next)->_M_next + 1))
          ;
          peVar10 = (element_type *)local_2a8._64_8_;
          this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._72_8_;
        }
      }
      if (peVar10 != (element_type *)0x0) {
        p_Var7 = local_230._M_next[1]._M_next;
        p_Var6 = (_List_node_base *)peVar10[1]._M_string_length;
        p_Var7[2]._M_next = (_List_node_base *)peVar10[1]._M_dataplus._M_p;
        p_Var7[2]._M_prev = p_Var6;
        p_Var7[3]._M_next = (_List_node_base *)peVar10[1].field_2._M_allocated_capacity;
        local_2a8._64_8_ = peVar10;
        local_2a8._72_8_ = this_02;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var7[3]._M_prev,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&peVar10[1].field_2 + 8));
        p_Var7 = local_230._M_next[1]._M_next;
        p_Var7[4]._M_next = (_List_node_base *)peVar10[2]._M_dataplus._M_p;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var7[4]._M_prev,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&peVar10[2]._M_string_length);
        this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._72_8_;
      }
      if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
      }
switchD_00162930_caseD_5e:
      p_Var7 = local_230._M_next;
      if (*(int *)&local_230._M_next[1]._M_next[1]._M_prev == 0) {
        p_Var6 = (_List_node_base *)operator_new(0x18);
        p_Var6[1]._M_next = p_Var7;
        std::__detail::_List_node_base::_M_hook(p_Var6);
        local_1f8 = local_1f8 + 1;
      }
      p_Var7 = p_Var7->_M_next;
      local_230._M_next = p_Var7;
      pppppuVar3 = local_208;
    } while (p_Var7 != (_List_node_base *)lexerStruct);
    for (; pppppuVar4 = local_208, (undefined1 ******)pppppuVar3 != &local_208;
        pppppuVar3 = (undefined1 *****)*pppppuVar3) {
      std::__cxx11::
      list<std::shared_ptr<nigel::Token>,_std::allocator<std::shared_ptr<nigel::Token>_>_>::_M_erase
                (lexerStruct,(_List_node_base *)pppppuVar3[2]);
    }
    while ((undefined1 ******)pppppuVar4 != &local_208) {
      pppppuVar3 = (undefined1 *****)*pppppuVar4;
      operator_delete(pppppuVar4,0x18);
      pppppuVar4 = pppppuVar3;
    }
  }
  return success;
}

Assistant:

ExecutionResult Lexer::postLexer( CodeBase &base )
	{
		std::shared_ptr<Token> tmp, tmp2;
		std::list<std::list<std::shared_ptr<Token>>::iterator> toRemove;

		for( auto token = base.lexerStruct.begin() ; token != base.lexerStruct.end() ; token++ )
		{
			if( ( *token )->type == Token::Type::identifier )
			{//Specify some tokens in more detail
				String identifier = ( *token )->as<Token_Identifier>()->identifier;

				if( identifier == "_EOF_" )
				{
					tmp = std::make_shared<Token>( Token::Type::eof );
					token->swap( tmp );
				}
				else if( identifier == "fn" )
				{
					tmp = std::make_shared<Token>( Token::Type::function );
					token->swap( tmp );
				}
				else if( identifier == "byte" )
				{
					tmp = std::make_shared<Token>( Token::Type::type_byte );
					token->swap( tmp );
				}
				else if( identifier == "int" )
				{
					tmp = std::make_shared<Token>( Token::Type::type_int );
					token->swap( tmp );
				}
				else if( identifier == "unsigned" )
				{
					tmp = std::make_shared<Token>( Token::Type::unsigned_attr );
					token->swap( tmp );
				}
				else if( identifier == "fast" )
				{
					tmp = std::make_shared<Token>( Token::Type::fast_attr );
					token->swap( tmp );
				}
				else if( identifier == "norm" )
				{
					tmp = std::make_shared<Token>( Token::Type::norm_attr );
					token->swap( tmp );
				}
				else if( identifier == "ptr" )
				{
					tmp = std::make_shared<Token>( Token::Type::type_ptr );
					token->swap( tmp );
				}
				else if( identifier == "if" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_if );
					token->swap( tmp );
				}
				else if( identifier == "else" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_else );
					token->swap( tmp );
				}
				else if( identifier == "while" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_while );
					token->swap( tmp );
				}
				else if( identifier == "for" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_for );
					token->swap( tmp );
				}
				else if( identifier == "do" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_do );
					token->swap( tmp );
				}
				else if( identifier == "break" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_break );
					token->swap( tmp );
				}
				else if( identifier == "return" )
				{
					tmp = std::make_shared<Token>( Token::Type::cf_return );
					token->swap( tmp );
				}
				else if( identifier == "new" )
				{
					tmp = std::make_shared<Token>( Token::Type::dy_new );
					token->swap( tmp );
				}
				else if( identifier == "delete" )
				{
					tmp = std::make_shared<Token>( Token::Type::dy_delete );
					token->swap( tmp );
				}
				else if( identifier == "true" )
				{
					tmp = std::make_shared<Token>( Token::Type::literalTrue );
					token->swap( tmp );
				}
				else if( identifier == "false" )
				{
					tmp = std::make_shared<Token>( Token::Type::literalFalse );
					token->swap( tmp );
				}
			}
			else if( ( *token )->type == Token::Type::operatorToken )
			{
				String identifier = ( *token )->as<Token_Operator>()->operatorToken;

				if( identifier.size() > 1 )
				{//May have to be splitted
					if( identifier.substr( 0, 3 ) == "<<=" || identifier.substr( 0, 3 ) == ">>=" )
					{
						if( identifier.size() > 3 )
						{//Split
							splitToken( identifier, 3, token, base.lexerStruct );
						}
					}
					else if( identifier.substr( 0, 2 ) == "&&" || identifier.substr( 0, 2 ) == "||" || identifier.substr( 0, 2 ) == "<<" || identifier.substr( 0, 2 ) == ">>" || identifier.substr( 0, 2 ) == ">=" || identifier.substr( 0, 2 ) == "<=" || identifier.substr( 0, 2 ) == "++" || identifier.substr( 0, 2 ) == "--" || identifier.substr( 0, 2 ) == "==" || identifier.substr( 0, 2 ) == "!=" || identifier.substr( 0, 2 ) == "+=" || identifier.substr( 0, 2 ) == "-=" || identifier.substr( 0, 2 ) == "*=" || identifier.substr( 0, 2 ) == "/=" || identifier.substr( 0, 2 ) == "%=" || identifier.substr( 0, 2 ) == "&=" || identifier.substr( 0, 2 ) == "|=" || identifier.substr( 0, 2 ) == "^=" )
					{
						if( identifier.size() > 2 )
						{//Split
							splitToken( identifier, 2, token, base.lexerStruct );
						}
					}

					if( identifier == "+=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_add_set );
						token->swap( tmp );
					}
					else if( identifier == "-=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_sub_set );
						token->swap( tmp );
					}
					else if( identifier == "*=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_mul_set );
						token->swap( tmp );
					}
					else if( identifier == "/=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_div_set );
						token->swap( tmp );
					}
					else if( identifier == "%=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_mod_set );
						token->swap( tmp );
					}
					else if( identifier == "==" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_eql );
						token->swap( tmp );
					}
					else if( identifier == "!=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_not_eql );
						token->swap( tmp );
					}
					else if( identifier == "<=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_less_eql );
						token->swap( tmp );
					}
					else if( identifier == ">=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_more_eql );
						token->swap( tmp );
					}
					else if( identifier == "&=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_and_set );
						token->swap( tmp );
					}
					else if( identifier == "|=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_or_set );
						token->swap( tmp );
					}
					else if( identifier == "^=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_xor_set );
						token->swap( tmp );
					}
					else if( identifier == "&&" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_and_log );
						token->swap( tmp );
					}
					else if( identifier == "||" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_or_log );
						token->swap( tmp );
					}
					else if( identifier == "<<" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_shift_left );
						token->swap( tmp );
					}
					else if( identifier == ">>" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_shift_right );
						token->swap( tmp );
					}
					else if( identifier == "<<=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_shift_left_set );
						token->swap( tmp );
					}
					else if( identifier == ">>=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_shift_right_set );
						token->swap( tmp );
					}
					else if( identifier == "++" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_inc );
						token->swap( tmp );
					}
					else if( identifier == "--" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_dec );
						token->swap( tmp );
					}
					else
					{//Split
						splitToken( identifier, 1, token, base.lexerStruct );
					}
				}
				if( identifier.size() == 1 )
				{//Single char operators
					String identifier = ( *token )->as<Token_Operator>()->operatorToken;

					if( identifier == "+" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_add );
						token->swap( tmp );
					}
					else if( identifier == "-" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_sub );
						token->swap( tmp );
					}
					else if( identifier == "*" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_mul );
						token->swap( tmp );
					}
					else if( identifier == "/" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_div );
						token->swap( tmp );
					}
					else if( identifier == "%" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_mod );
						token->swap( tmp );
					}
					else if( identifier == "=" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_set );
						token->swap( tmp );
					}
					else if( identifier == "<" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_less );
						token->swap( tmp );
					}
					else if( identifier == ">" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_more );
						token->swap( tmp );
					}
					else if( identifier == "!" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_not );
						token->swap( tmp );
					}
					else if( identifier == "&" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_and );
						token->swap( tmp );
					}
					else if( identifier == "|" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_or );
						token->swap( tmp );
					}
					else if( identifier == "^" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_xor );
						token->swap( tmp );
					}
					else if( identifier == "~" )
					{
						tmp = std::make_shared<Token>( Token::Type::op_inv );
						token->swap( tmp );
					}
				}
			}
			else if( ( *token )->type == Token::Type::dividingToken )
			{
				u8 t = ( *token )->as<Token_DividingToken>()->token;

				if( t == '$' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_dollar );
					token->swap( tmp );
				}
				else if( t == '#' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_hash );
					token->swap( tmp );
				}
				else if( t == '(' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_parenthesis_open );
					token->swap( tmp );
				}
				else if( t == ')' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_parenthesis_close );
					token->swap( tmp );
				}
				else if( t == '[' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_bracket_open );
					token->swap( tmp );
				}
				else if( t == ']' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_bracket_close );
					token->swap( tmp );
				}
				else if( t == '{' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_brace_open );
					token->swap( tmp );
				}
				else if( t == '}' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_brace_close );
					token->swap( tmp );
				}
				else if( t == ',' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_comma );
					token->swap( tmp );
				}
				else if( t == '.' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_period );
					token->swap( tmp );
				}
				else if( t == ':' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_colon );
					token->swap( tmp );
				}
				else if( t == ';' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_semicolon );
					token->swap( tmp );
				}
				else if( t == '?' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_questionmark );
					token->swap( tmp );
				}
				else if( t == '@' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_at );
					token->swap( tmp );
				}
				else if( t == '\\' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_backslash );
					token->swap( tmp );
				}
				else if( t == '`' )
				{
					tmp = std::make_shared<Token>( Token::Type::tok_grave );
					token->swap( tmp );
				}
			}
			if( tmp != nullptr )
			{//Move also metadata. Use inverted order because of swap
				( *token )->lineNo = tmp->lineNo;
				( *token )->columnNo = tmp->columnNo;
				( *token )->line = tmp->line;
				( *token )->path = tmp->path;
			}
			tmp = nullptr;

			if( ( *token )->type == Token::Type::empty )
			{
				toRemove.push_back( token );
			}
		}

		//Remove empty token, if any
		for( auto &remove : toRemove )
		{
			base.lexerStruct.erase( remove );
		}

		return ExecutionResult::success;
	}